

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_334836::TestCallback::toAdmin
          (TestCallback *this,Message *message,SessionID *param_2)

{
  long lVar1;
  MsgType msgType;
  FieldBase local_70;
  
  FIX::MsgType::MsgType((MsgType *)&local_70);
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_70);
  switch(*local_70.m_string._M_dataplus._M_p) {
  case '0':
    this->toHeartbeat = this->toHeartbeat + 1;
    lVar1 = 0x490;
    goto LAB_0023e80a;
  case '1':
    break;
  case '2':
    this->toResendRequest = this->toResendRequest + 1;
    lVar1 = 0x338;
    goto LAB_0023e80a;
  case '3':
    this->toReject = this->toReject + 1;
    break;
  case '4':
    this->toSequenceReset = this->toSequenceReset + 1;
    break;
  case '5':
    this->toLogout = this->toLogout + 1;
    break;
  default:
    if (*local_70.m_string._M_dataplus._M_p != 'A') break;
    this->toLogon = this->toLogon + 1;
    lVar1 = 0x1e0;
LAB_0023e80a:
    FIX::Message::operator=
              ((Message *)((long)&(this->super_Responder)._vptr_Responder + lVar1),message);
  }
  FIX::FieldBase::~FieldBase(&local_70);
  return;
}

Assistant:

virtual void toAdmin(FIX::Message &message, const SessionID &) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    switch (msgType.getValue()[0]) {
    case 'A':
      toLogon++;
      sentLogon = message;
      break;
    case '2':
      toResendRequest++;
      sentResendRequest = message;
      break;
    case '0':
      toHeartbeat++;
      sentHeartbeat = message;
      break;
    case '5':
      toLogout++;
      break;
    case '3':
      toReject++;
      break;
    case '4':
      toSequenceReset++;
      break;
    }
  }